

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O2

bool __thiscall cmTarget::IsXCTestOnApple(cmTarget *this)

{
  bool bVar1;
  allocator local_31;
  string local_30;
  
  bVar1 = IsCFBundleOnApple(this);
  if (bVar1) {
    std::__cxx11::string::string((string *)&local_30,"XCTEST",&local_31);
    bVar1 = GetPropertyAsBool(this,&local_30);
    std::__cxx11::string::~string((string *)&local_30);
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool cmTarget::IsXCTestOnApple() const
{
  return (this->IsCFBundleOnApple() &&
          this->GetPropertyAsBool("XCTEST"));
}